

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:506:11)>
::getImpl(SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:506:11)>
          *this,ExceptionOrValue *output)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2 aVar1;
  ExceptionOr<unsigned_long> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2 local_380;
  ExceptionOr<kj::Promise<kj::String>_> local_378;
  ExceptionOrValue local_1d0;
  char local_38;
  
  local_1d0.exception.ptr.isSet = false;
  local_38 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1d0);
  if (local_1d0.exception.ptr.isSet == true) {
    local_378.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1d0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1d0.exception.ptr.field_1.value.ownFile.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1d0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1d0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1d0.exception.ptr.field_1.value.file;
    local_378.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1d0.exception.ptr.field_1._32_8_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1d0.exception.ptr.field_1.value.description.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1d0.exception.ptr.field_1.value.description.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1d0.exception.ptr.field_1.value.description.content.disposer;
    local_1d0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1d0.exception.ptr.field_1.value.context.ptr.disposer;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1d0.exception.ptr.field_1.value.context.ptr.ptr;
    local_1d0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1d0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1d0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_378.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1d0.exception.ptr.field_1 + 0x68),0x105);
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1d0.exception.ptr.field_1.value.details.builder.ptr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1d0.exception.ptr.field_1.value.details.builder.pos;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1d0.exception.ptr.field_1.value.details.builder.endPtr;
    local_378.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1d0.exception.ptr.field_1.value.details.builder.disposer;
    local_1d0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1d0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_378.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::String>_>::operator=
              ((ExceptionOr<kj::Promise<kj::String>_> *)output,&local_378);
    aVar1 = local_378.value.ptr.field_1;
    if ((local_378.value.ptr.isSet == true) &&
       (local_378.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0)) {
      local_378.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  else {
    if (local_38 != '\x01') goto LAB_002123f3;
    anon_class_16_2_5e707987_for_func::operator()
              ((anon_class_16_2_5e707987_for_func *)&local_380.value,(size_t)&this->func);
    local_378.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_378.value.ptr.isSet = true;
    local_378.value.ptr.field_1 = local_380;
    local_380 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0;
    ExceptionOr<kj::Promise<kj::String>_>::operator=
              ((ExceptionOr<kj::Promise<kj::String>_> *)output,&local_378);
    aVar1 = local_378.value.ptr.field_1;
    if ((local_378.value.ptr.isSet == true) &&
       (local_378.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0)) {
      local_378.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::String>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  if (local_378.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_378.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002123f3:
  if (local_1d0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1d0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }